

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O3

int testSpanTestsMakeSpanVectorMutable(void)

{
  ostream *poVar1;
  long lVar2;
  int iVar3;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> values;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> local_30;
  int local_18 [4];
  
  local_18[0] = 1;
  local_18[1] = 2;
  local_18[2] = 3;
  local_18[3] = 4;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,&local_31);
  lVar2 = (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if (lVar2 == 4) {
    iVar3 = 0;
    if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start == (pointer)0x0 ||
        local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) goto LAB_001bc34f;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"(span.Data()) == (values.data())",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  }
  else if (lVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"!span.IsEmpty()",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
               ,0x71);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x34);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(span.Size()) == (size_t(4))",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  }
  std::ostream::put((char)poVar1);
  iVar3 = 1;
  std::ostream::flush();
LAB_001bc34f:
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar3;
}

Assistant:

int testSpanTestsMakeSpanVectorMutable()
{
    std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);
    static_assert(std::is_same<decltype(span)::value_type, int>::value, "MakeSpan should make non-const T");

    ML_ASSERT(!span.IsEmpty());
    ML_ASSERT_EQ(span.Size(), size_t(4));
    ML_ASSERT_EQ(span.Data(), values.data());

    return 0;
}